

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msa_helper.c
# Opt level: O0

int64_t msa_nlzc_df(uint32_t df,int64_t arg)

{
  char cVar1;
  ulong uVar2;
  undefined4 local_30;
  undefined4 local_2c;
  int c;
  int n;
  uint64_t y;
  uint64_t x;
  int64_t arg_local;
  uint32_t df_local;
  
  cVar1 = (char)df;
  y = arg & 0xffffffffffffffffU >> (0x40U - (char)(1L << (cVar1 + 3U & 0x3f)) & 0x3f);
  local_2c = (int)(1L << (cVar1 + 3U & 0x3f));
  local_30 = (int)((ulong)(1L << (cVar1 + 3U & 0x3f)) >> 1);
  do {
    uVar2 = y >> ((byte)local_30 & 0x3f);
    if (uVar2 != 0) {
      local_2c = local_2c - local_30;
      y = uVar2;
    }
    local_30 = local_30 >> 1;
  } while (local_30 != 0);
  return (long)local_2c - y;
}

Assistant:

static inline int64_t msa_nlzc_df(uint32_t df, int64_t arg)
{
    uint64_t x, y;
    int n, c;

    x = UNSIGNED(arg, df);
    n = DF_BITS(df);
    c = DF_BITS(df) / 2;

    do {
        y = x >> c;
        if (y != 0) {
            n = n - c;
            x = y;
        }
        c = c >> 1;
    } while (c != 0);

    return n - x;
}